

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# html.h
# Opt level: O0

void __thiscall kiste::html::escape(html *this,char *c)

{
  char *c_local;
  html *this_local;
  
  switch(*c) {
  case '\"':
    std::operator<<(this->_os,"&quot;");
    break;
  default:
    std::operator<<(this->_os,*c);
    break;
  case '&':
    std::operator<<(this->_os,"&amp;");
    break;
  case '\'':
    std::operator<<(this->_os,"&#39;");
    break;
  case '<':
    std::operator<<(this->_os,"&lt;");
    break;
  case '>':
    std::operator<<(this->_os,"&gt;");
  }
  return;
}

Assistant:

auto escape(const char& c) -> void
    {
      switch (c)
      {
      case '<':
        _os << "&lt;";
        break;
      case '>':
        _os << "&gt;";
        break;
      case '\'':
        _os << "&#39;";
        break;
      case '"':
        _os << "&quot;";
        break;
      case '&':
        _os << "&amp;";
        break;
      default:
        _os << c;
      }
    }